

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O1

bool __thiscall
iDynTree::Rotation::getQuaternion(Rotation *this,double *s,double *r1,double *r2,double *r3)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  dVar8 = (this->super_Matrix3x3).m_data[0];
  dVar4 = (this->super_Matrix3x3).m_data[4];
  dVar7 = (this->super_Matrix3x3).m_data[8];
  dVar6 = ((dVar8 - dVar4) - dVar7) + 1.0;
  dVar1 = ((dVar4 - dVar8) - dVar7) + 1.0;
  dVar5 = 0.0;
  if (0.0 <= dVar6) {
    dVar5 = dVar6;
  }
  dVar6 = 0.0;
  if (0.0 <= dVar1) {
    dVar6 = dVar1;
  }
  auVar9._8_8_ = dVar7 + (-dVar8 - dVar4) + 1.0;
  auVar9._0_8_ = dVar7 + dVar8 + dVar4 + 1.0;
  auVar9 = maxpd(ZEXT816(0),auVar9);
  dVar4 = auVar9._8_8_;
  dVar8 = auVar9._0_8_;
  if (((dVar8 < dVar4) || (dVar8 < dVar5)) || (dVar8 < dVar6)) {
    if (((dVar5 < dVar4) || (dVar5 < dVar8)) || (dVar5 < dVar6)) {
      if (((dVar6 < dVar4) || (dVar6 < dVar8)) || (dVar6 < dVar5)) {
        if (((dVar4 < dVar6) || (dVar4 < dVar8)) || (dVar4 < dVar5)) {
          reportError("Rotation","getQuaternion","Quaternion numerically bad conditioned");
          return false;
        }
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar6 = dVar4 + dVar4;
        dVar8 = ((this->super_Matrix3x3).m_data[3] - (this->super_Matrix3x3).m_data[1]) / dVar6;
        dVar5 = ((this->super_Matrix3x3).m_data[6] + (this->super_Matrix3x3).m_data[2]) / dVar6;
        dVar6 = ((this->super_Matrix3x3).m_data[5] + (this->super_Matrix3x3).m_data[7]) / dVar6;
        dVar4 = dVar4 * 0.5;
      }
      else {
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        dVar4 = dVar6 + dVar6;
        dVar8 = ((this->super_Matrix3x3).m_data[2] - (this->super_Matrix3x3).m_data[6]) / dVar4;
        dVar5 = ((this->super_Matrix3x3).m_data[3] + (this->super_Matrix3x3).m_data[1]) / dVar4;
        dVar4 = ((this->super_Matrix3x3).m_data[5] + (this->super_Matrix3x3).m_data[7]) / dVar4;
        dVar6 = dVar6 * 0.5;
      }
    }
    else {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar4 = dVar5 + dVar5;
      dVar8 = ((this->super_Matrix3x3).m_data[7] - (this->super_Matrix3x3).m_data[5]) / dVar4;
      dVar6 = ((this->super_Matrix3x3).m_data[3] + (this->super_Matrix3x3).m_data[1]) / dVar4;
      dVar4 = ((this->super_Matrix3x3).m_data[6] + (this->super_Matrix3x3).m_data[2]) / dVar4;
      dVar5 = dVar5 * 0.5;
    }
  }
  else {
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar4 = dVar8 + dVar8;
    dVar5 = ((this->super_Matrix3x3).m_data[7] - (this->super_Matrix3x3).m_data[5]) / dVar4;
    dVar6 = ((this->super_Matrix3x3).m_data[2] - (this->super_Matrix3x3).m_data[6]) / dVar4;
    dVar4 = ((this->super_Matrix3x3).m_data[3] - (this->super_Matrix3x3).m_data[1]) / dVar4;
    dVar8 = dVar8 * 0.5;
  }
  dVar7 = 1.0;
  if (ABS(dVar8) <= 1e-07) {
    if (1e-07 < ABS(dVar5)) {
      bVar3 = dVar5 == 0.0;
      bVar2 = dVar5 < 0.0;
    }
    else if (1e-07 < ABS(dVar6)) {
      bVar3 = dVar6 == 0.0;
      bVar2 = dVar6 < 0.0;
    }
    else {
      if (ABS(dVar4) <= 1e-07) goto LAB_00131f65;
      bVar3 = dVar4 == 0.0;
      bVar2 = dVar4 < 0.0;
    }
  }
  else {
    bVar3 = dVar8 == 0.0;
    bVar2 = dVar8 < 0.0;
  }
  dVar7 = *(double *)(&DAT_00153400 + (ulong)(!bVar2 && !bVar3) * 8);
LAB_00131f65:
  dVar8 = dVar8 / dVar7;
  dVar5 = dVar5 / dVar7;
  dVar6 = dVar6 / dVar7;
  dVar4 = dVar4 / dVar7;
  dVar7 = dVar4 * dVar4 + dVar6 * dVar6 + dVar8 * dVar8 + dVar5 * dVar5;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  *s = dVar8 / dVar7;
  *r1 = dVar5 / dVar7;
  *r2 = dVar6 / dVar7;
  *r3 = dVar4 / dVar7;
  return true;
}

Assistant:

bool Rotation::getQuaternion(double &s, double &r1, double &r2, double &r3) const
    {
        Eigen::Map<const Matrix3dRowMajor> R(m_data);

        //Taken from "Contributions au contrôle automatique de véhicules aériens"
        //PhD thesis of "Minh Duc HUA"
        //INRIA Sophia Antipolis
        //www.isir.upmc.fr/files/2009THDR2323.pdf
        //Equation 3.9 (page 101)

        //Diagonal elements used only to find the maximum
        //the furthest value from zero
        //we use this value as denominator to find the other elements
        double q0 = ( R(0,0) + R(1,1) + R(2,2) + 1.0);
        double q1 = ( R(0,0) - R(1,1) - R(2,2) + 1.0);
        double q2 = (-R(0,0) + R(1,1) - R(2,2) + 1.0);
        double q3 = (-R(0,0) - R(1,1) + R(2,2) + 1.0);

        if (q0 < 0.0) q0 = 0.0;
        if (q1 < 0.0) q1 = 0.0;
        if (q2 < 0.0) q2 = 0.0;
        if (q3 < 0.0) q3 = 0.0;

        if (q0 >= q1 && q0 >= q2 && q0 >= q3) {
            q0 = std::sqrt(q0);
            q1 = (R(2,1) - R(1,2)) / (2.0 * q0);
            q2 = (R(0,2) - R(2,0)) / (2.0 * q0);
            q3 = (R(1,0) - R(0,1)) / (2.0 * q0);
            q0 /= 2.0;
        } else if (q1 >= q0 && q1 >= q2 && q1 >= q3) {
            q1 = std::sqrt(q1);
            q0 = (R(2,1) - R(1,2)) / (2.0 * q1);
            q2 = (R(1,0) + R(0,1)) / (2.0 * q1);
            q3 = (R(2,0) + R(0,2)) / (2.0 * q1);
            q1 /= 2.0;
        } else if (q2 >= q0 && q2 >= q1 && q2 >= q3) {
            q2 = std::sqrt(q2);
            q0 = (R(0,2) - R(2,0)) / (2.0 * q2);
            q1 = (R(1,0) + R(0,1)) / (2.0 * q2);
            q3 = (R(1,2) + R(2,1)) / (2.0 * q2);
            q2 /= 2.0;
        } else if (q3 >= q0 && q3 >= q1 && q3 >= q2) {
            q3 = std::sqrt(q3);
            q0 = (R(1,0) - R(0,1)) / (2.0 * q3);
            q1 = (R(2,0) + R(0,2)) / (2.0 * q3);
            q2 = (R(1,2) + R(2,1)) / (2.0 * q3);
            q3 /= 2.0;
        } else {
            reportError("Rotation", "getQuaternion", "Quaternion numerically bad conditioned");
            return false;
        }

        //Here we impose that the leftmost nonzero element of the quaternion is positive
        double eps = 1e-7;
        double sign = 1.0;
        if (q0 > eps || q0 < -eps) {
            sign = q0 > 0 ? 1.0 : -1.0;
        } else if (q1 > eps || q1 < -eps) {
            sign = q1 > 0 ? 1.0 : -1.0;
        } else if (q2 > eps || q2 < -eps) {
            sign = q2 > 0 ? 1.0 : -1.0;
        } else if (q3 > eps || q3 < -eps) {
            sign = q3 > 0 ? 1.0 : -1.0;
        }

        q0 /= sign;
        q1 /= sign;
        q2 /= sign;
        q3 /= sign;

        double quaternionNorm = std::sqrt(q0 * q0 +
                                          q1 * q1 +
                                          q2 * q2 +
                                          q3 * q3);
        s  = q0 / quaternionNorm;
        r1 = q1 / quaternionNorm;
        r2 = q2 / quaternionNorm;
        r3 = q3 / quaternionNorm;
        return true;
    }